

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.h
# Opt level: O0

void __thiscall spvtools::opt::LoopUtils::LoopUtils(LoopUtils *this,IRContext *context,Loop *loop)

{
  BasicBlock *pBVar1;
  Function *pFVar2;
  LoopDescriptor *pLVar3;
  Loop *loop_local;
  IRContext *context_local;
  LoopUtils *this_local;
  
  this->context_ = context;
  pBVar1 = Loop::GetHeaderBlock(loop);
  pFVar2 = BasicBlock::GetParent(pBVar1);
  pLVar3 = IRContext::GetLoopDescriptor(context,pFVar2);
  this->loop_desc_ = pLVar3;
  this->loop_ = loop;
  pBVar1 = Loop::GetHeaderBlock(this->loop_);
  pFVar2 = BasicBlock::GetParent(pBVar1);
  this->function_ = pFVar2;
  return;
}

Assistant:

LoopUtils(IRContext* context, Loop* loop)
      : context_(context),
        loop_desc_(
            context->GetLoopDescriptor(loop->GetHeaderBlock()->GetParent())),
        loop_(loop),
        function_(*loop_->GetHeaderBlock()->GetParent()) {}